

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (SelectorSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  bool bVar1;
  optional<int> value;
  undefined1 uVar2;
  ulong extraout_RDX;
  RangeSelectSyntax *rs;
  SourceRange range;
  SequenceRange SVar4;
  _Storage<unsigned_int,_true> local_28;
  _Storage<unsigned_int,_true> _Stack_24;
  ulong uVar3;
  
  if ((syntax->super_SyntaxNode).kind == BitSelect) {
    value = ASTContext::evalInteger
                      (context,*(ExpressionSyntax **)&syntax[1].super_SyntaxNode,
                       (bitmask<slang::ast::ASTFlags>)0x80000);
    local_28._M_value = 1;
    uVar2 = 0;
    range = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    bVar1 = ASTContext::requirePositive(context,value,range);
    uVar3 = extraout_RDX;
    if (bVar1) {
      local_28._M_value =
           value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      uVar2 = 1;
      _Stack_24._M_value = local_28._M_value;
    }
  }
  else {
    SVar4 = fromSyntax((RangeSelectSyntax *)syntax,context,allowUnbounded);
    uVar3 = (ulong)SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._4_4_;
    local_28._M_value = SVar4.min;
    _Stack_24._M_value =
         SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
    uVar2 = SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
  }
  SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_24._M_value;
  SVar4.min = local_28._M_value;
  SVar4.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ = (undefined4)CONCAT71((int7)(uVar3 >> 8),uVar2);
  return SVar4;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const SelectorSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    if (syntax.kind == SyntaxKind::BitSelect) {
        auto val = context.evalInteger(*syntax.as<BitSelectSyntax>().expr,
                                       ASTFlags::AssertionDelayOrRepetition);

        SequenceRange range;
        if (context.requirePositive(val, syntax.sourceRange()))
            range.max = range.min = uint32_t(*val);

        return range;
    }
    else {
        auto& rs = syntax.as<RangeSelectSyntax>();
        return fromSyntax(rs, context, allowUnbounded);
    }
}